

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_20.cpp
# Opt level: O2

ChStressTensor<double> * __thiscall
chrono::fea::ChElementHexaCorot_20::GetStress
          (ChStressTensor<double> *__return_storage_ptr__,ChElementHexaCorot_20 *this,double z1,
          double z2,double z3)

{
  element_type *peVar1;
  Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
  local_58;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_48 [48];
  
  peVar1 = (this->Material).
           super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  GetStrain((ChStrainTensor<double> *)local_48,this,z1,z2,z3);
  local_58 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)
                        &peVar1->StressStrainMatrix,local_48);
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,6,1,0,6,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
              *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

ChStressTensor<> ChElementHexaCorot_20::GetStress(double z1, double z2, double z3) {
    ChStressTensor<> mstress = this->Material->Get_StressStrainMatrix() * this->GetStrain(z1, z2, z3);
    return mstress;
}